

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int nsc_lookup_cb(lws_cache_nscookiejar_t *cache,void *opaque,int flags,char *buf,size_t size)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char local_118 [4];
  int tl;
  char tag [200];
  lws_usec_t local_48;
  lws_usec_t expiry;
  nsc_lookup_ctx *ctx;
  size_t size_local;
  char *buf_local;
  void *pvStack_20;
  int flags_local;
  void *opaque_local;
  lws_cache_nscookiejar_t *cache_local;
  
  if ((flags & 1U) == 0) {
    if (*(long *)((long)opaque + 0x10) != 0) {
      *(size_t *)(*(long *)((long)opaque + 0x10) + 0x20) =
           size + *(long *)(*(long *)((long)opaque + 0x10) + 0x20);
    }
    cache_local._4_4_ = 0;
  }
  else {
    *(undefined8 *)((long)opaque + 0x10) = 0;
    expiry = (lws_usec_t)opaque;
    ctx = (nsc_lookup_ctx *)size;
    size_local = (size_t)buf;
    buf_local._4_4_ = flags;
    pvStack_20 = opaque;
    opaque_local = cache;
    iVar1 = nsc_line_to_tag(buf,size,local_118,200,&local_48);
    if (iVar1 == 0) {
      iVar1 = lws_cache_nscookiejar_tag_match
                        ((lws_cache_ttl_lru *)opaque_local,*(char **)expiry,local_118,'\x01');
      if (iVar1 == 0) {
        sVar2 = strlen(local_118);
        pvVar3 = lws_realloc((void *)0x0,(sVar2 & 0xffffffff) + 0x31,"nsc_lookup_cb");
        *(void **)(expiry + 0x10) = pvVar3;
        if (*(long *)(expiry + 0x10) == 0) {
          cache_local._4_4_ = -1;
        }
        else {
          *(nsc_lookup_ctx **)(*(long *)(expiry + 0x10) + 0x20) = ctx;
          *(long *)(*(long *)(expiry + 0x10) + 0x28) = (long)(int)sVar2;
          *(lws_usec_t *)(*(long *)(expiry + 0x10) + 0x18) = local_48;
          memset(*(void **)(expiry + 0x10),0,0x18);
          memcpy((void *)(*(long *)(expiry + 0x10) + 0x30),local_118,(long)(int)sVar2 + 1);
          lws_dll2_add_tail(*(lws_dll2 **)(expiry + 0x10),*(lws_dll2_owner **)(expiry + 8));
          cache_local._4_4_ = 0;
        }
      }
      else {
        cache_local._4_4_ = 0;
      }
    }
    else {
      cache_local._4_4_ = 0;
    }
  }
  return cache_local._4_4_;
}

Assistant:

static int
nsc_lookup_cb(lws_cache_nscookiejar_t *cache, void *opaque, int flags,
	      const char *buf, size_t size)
{
	struct nsc_lookup_ctx *ctx = (struct nsc_lookup_ctx *)opaque;
	lws_usec_t expiry;
	char tag[200];
	int tl;

	if (!(flags & LCN_SOL)) {
		if (ctx->match)
			ctx->match->payload_size += size;

		return NIR_CONTINUE;
	}

	/*
	 * There should be enough in buf to match or reject it... let's
	 * synthesize a tag from the text "line" and then check the tags for
	 * a match
	 */

	ctx->match = NULL; /* new SOL means stop tracking payload len */

	if (nsc_line_to_tag(buf, size, tag, sizeof(tag), &expiry))
		return NIR_CONTINUE;

	if (lws_cache_nscookiejar_tag_match(&cache->cache,
					    ctx->wildcard_key, tag, 1))
		return NIR_CONTINUE;

	tl = (int)strlen(tag);

	/*
	 * ... it looks like a match then... create new match
	 * object with the specific tag, and add it to the owner list
	 */

	ctx->match = lws_fi(&cache->cache.info.cx->fic, "cache_lookup_oom") ? NULL :
			lws_malloc(sizeof(*ctx->match) + (unsigned int)tl + 1u,
				__func__);
	if (!ctx->match)
		/* caller of lookup will clean results list on fail */
		return NIR_FINISH_ERROR;

	ctx->match->payload_size = size;
	ctx->match->tag_size = (size_t)tl;
	ctx->match->expiry = expiry;

	memset(&ctx->match->list, 0, sizeof(ctx->match->list));
	memcpy(&ctx->match[1], tag, (size_t)tl + 1u);
	lws_dll2_add_tail(&ctx->match->list, ctx->results_owner);

	return NIR_CONTINUE;
}